

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
slang::function_ref<std::__cxx11::string()>::
callback_fn<slang::syntax::SyntaxTree::create(slang::SourceManager&,nonstd::span_lite::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,nonstd::span_lite::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)::__0>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,function_ref<std::__cxx11::string()> *this,intptr_t callable)

{
  intptr_t callable_local;
  
  slang::syntax::SyntaxTree::
  create(slang::SourceManager&,nonstd::span_lite::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,nonstd::span_lite::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)
  ::$_0::operator()[abi_cxx11_(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }